

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O2

uint256 * BlockWitnessMerkleRoot(uint256 *__return_storage_ptr__,CBlock *block,bool *mutated)

{
  uchar *puVar1;
  long lVar2;
  pointer psVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  vector<uint256,_std::allocator<uint256>_> hashes;
  pointer puVar8;
  pointer puVar9;
  size_t s;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffa8;
  vector<uint256,_std::allocator<uint256>_> leaves;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            (&leaves,(long)(block->vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(block->vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  base_blob<256U>::SetNull
            (&(leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>);
  puVar9 = leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = 0x10;
  for (uVar10 = 1;
      psVar3 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(block->vtx).
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
      uVar10 = uVar10 + 1) {
    lVar4 = *(long *)((long)&(psVar3->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar11);
    uVar5 = *(undefined8 *)(lVar4 + 0x59);
    uVar6 = *(undefined8 *)(lVar4 + 0x61);
    uVar7 = *(undefined8 *)(lVar4 + 0x71);
    puVar1 = ((leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
             lVar11 * 2 + 0x10;
    *(undefined8 *)puVar1 = *(undefined8 *)(lVar4 + 0x69);
    *(undefined8 *)(puVar1 + 8) = uVar7;
    puVar1 = ((leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
             lVar11 * 2;
    *(undefined8 *)puVar1 = uVar5;
    *(undefined8 *)(puVar1 + 8) = uVar6;
    lVar11 = lVar11 + 0x10;
  }
  leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  leaves.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar8;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffffa8;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar9;
  ComputeMerkleRoot(__return_storage_ptr__,hashes,(bool *)&stack0xffffffffffffffb0);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            ((_Vector_base<uint256,_std::allocator<uint256>_> *)&stack0xffffffffffffffb0);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&leaves.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 BlockWitnessMerkleRoot(const CBlock& block, bool* mutated)
{
    std::vector<uint256> leaves;
    leaves.resize(block.vtx.size());
    leaves[0].SetNull(); // The witness hash of the coinbase is 0.
    for (size_t s = 1; s < block.vtx.size(); s++) {
        leaves[s] = block.vtx[s]->GetWitnessHash();
    }
    return ComputeMerkleRoot(std::move(leaves), mutated);
}